

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3DbRealloc(sqlite3 *db,void *p,int n)

{
  int iVar1;
  void *pvVar2;
  
  if (db->mallocFailed == '\0') {
    if (p == (void *)0x0) {
      pvVar2 = sqlite3DbMallocRaw(db,n);
      return pvVar2;
    }
    if ((p < (db->lookaside).pStart) || ((db->lookaside).pEnd <= p)) {
      iVar1 = sqlite3_initialize();
      if (iVar1 == 0) {
        pvVar2 = sqlite3Realloc(p,n);
      }
      else {
        pvVar2 = (void *)0x0;
      }
      if (pvVar2 != (void *)0x0) {
        return pvVar2;
      }
      db->mallocFailed = '\x01';
    }
    else {
      if (n <= (int)(uint)(db->lookaside).sz) {
        return p;
      }
      pvVar2 = sqlite3DbMallocRaw(db,n);
      if (pvVar2 != (void *)0x0) {
        memcpy(pvVar2,p,(ulong)(db->lookaside).sz);
        sqlite3DbFree(db,p);
        return pvVar2;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

SQLITE_PRIVATE void *sqlite3DbRealloc(sqlite3 *db, void *p, int n){
  void *pNew = 0;
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  if( db->mallocFailed==0 ){
    if( p==0 ){
      return sqlite3DbMallocRaw(db, n);
    }
    if( isLookaside(db, p) ){
      if( n<=db->lookaside.sz ){
        return p;
      }
      pNew = sqlite3DbMallocRaw(db, n);
      if( pNew ){
        memcpy(pNew, p, db->lookaside.sz);
        sqlite3DbFree(db, p);
      }
    }else{
      assert( sqlite3MemdebugHasType(p, MEMTYPE_DB) );
      assert( sqlite3MemdebugHasType(p, MEMTYPE_LOOKASIDE|MEMTYPE_HEAP) );
      sqlite3MemdebugSetType(p, MEMTYPE_HEAP);
      pNew = sqlite3_realloc(p, n);
      if( !pNew ){
        sqlite3MemdebugSetType(p, MEMTYPE_DB|MEMTYPE_HEAP);
        db->mallocFailed = 1;
      }
      sqlite3MemdebugSetType(pNew, MEMTYPE_DB | 
            (db->lookaside.bEnabled ? MEMTYPE_LOOKASIDE : MEMTYPE_HEAP));
    }
  }
  return pNew;
}